

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_tec_surf_zone(REF_GRID ref_grid,FILE *file)

{
  REF_CELL pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  REF_NODE pRVar8;
  REF_INT RVar9;
  int iVar10;
  long lVar11;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT *g2l;
  REF_INT nface;
  REF_INT *l2g;
  REF_INT nodes [27];
  uint local_ec;
  uint local_e4;
  REF_DICT local_e0;
  REF_GRID local_d8;
  REF_NODE local_d0;
  REF_INT *local_c8;
  uint local_bc;
  REF_INT *local_b8;
  long local_b0;
  uint local_a8 [30];
  
  pRVar8 = ref_grid->node;
  uVar3 = ref_dict_create(&local_e0);
  if (uVar3 == 0) {
    pRVar1 = ref_grid->cell[3];
    local_d8 = ref_grid;
    local_d0 = pRVar8;
    if (0 < pRVar1->max) {
      RVar9 = 0;
      do {
        RVar4 = ref_cell_nodes(pRVar1,RVar9,(REF_INT *)local_a8);
        if ((RVar4 == 0) &&
           (uVar3 = ref_dict_store(local_e0,local_a8[pRVar1->node_per],-1), pRVar8 = local_d0,
           uVar3 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x19b,"ref_export_tec_surf_zone",(ulong)uVar3,"mark tri");
          return uVar3;
        }
        RVar9 = RVar9 + 1;
      } while (RVar9 < pRVar1->max);
    }
    pRVar1 = local_d8->cell[6];
    if (0 < pRVar1->max) {
      iVar10 = 0;
      do {
        RVar4 = ref_cell_nodes(pRVar1,iVar10,(REF_INT *)local_a8);
        if ((RVar4 == 0) &&
           (uVar3 = ref_dict_store(local_e0,local_a8[pRVar1->node_per],-1), pRVar8 = local_d0,
           uVar3 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x1a0,"ref_export_tec_surf_zone",(ulong)uVar3,"mark qua");
          return uVar3;
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < pRVar1->max);
    }
    if (local_e0->n < 1) {
      local_ec = 0xffffffff;
    }
    else {
      local_ec = *local_e0->key;
    }
    if (0 < local_e0->n) {
      lVar11 = 0;
      do {
        local_b0 = lVar11;
        uVar3 = ref_grid_tri_qua_id_nodes
                          (local_d8,local_ec,(REF_INT *)&local_e4,(REF_INT *)&local_bc,&local_c8,
                           &local_b8);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x1a5,"ref_export_tec_surf_zone",(ulong)uVar3,"extract this boundary");
          return uVar3;
        }
        fprintf((FILE *)file,
                "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                (ulong)local_ec,(ulong)local_e4,(ulong)local_bc,"point","fequadrilateral");
        if (0 < (int)local_e4) {
          lVar11 = 0;
          do {
            pRVar2 = pRVar8->real;
            lVar5 = (long)local_b8[lVar11];
            fprintf((FILE *)file," %.16e %.16e %.16e\n",pRVar2[lVar5 * 0xf],pRVar2[lVar5 * 0xf + 1],
                    pRVar2[lVar5 * 0xf + 2]);
            lVar11 = lVar11 + 1;
          } while (lVar11 < (int)local_e4);
        }
        pRVar1 = local_d8->cell[3];
        if (0 < pRVar1->max) {
          RVar9 = 0;
          do {
            RVar4 = ref_cell_nodes(pRVar1,RVar9,(REF_INT *)local_a8);
            if ((RVar4 == 0) && (local_ec == local_a8[pRVar1->node_per])) {
              local_a8[3] = local_a8[2];
              lVar11 = 0;
              do {
                fprintf((FILE *)file," %d",(ulong)(local_c8[(int)local_a8[lVar11]] + 1));
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              fputc(10,(FILE *)file);
            }
            RVar9 = RVar9 + 1;
          } while (RVar9 < pRVar1->max);
        }
        pRVar1 = local_d8->cell[6];
        if (0 < pRVar1->max) {
          iVar10 = 0;
          do {
            RVar4 = ref_cell_nodes(pRVar1,iVar10,(REF_INT *)local_a8);
            if ((RVar4 == 0) && (local_ec == local_a8[pRVar1->node_per])) {
              lVar11 = 0;
              do {
                fprintf((FILE *)file," %d",(ulong)(local_c8[(int)local_a8[lVar11]] + 1));
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              fputc(10,(FILE *)file);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < pRVar1->max);
        }
        if (local_b8 != (REF_INT *)0x0) {
          free(local_b8);
        }
        if (local_c8 != (REF_INT *)0x0) {
          free(local_c8);
        }
        lVar11 = local_b0 + 1;
        local_ec = 0xffffffff;
        if (lVar11 < local_e0->n) {
          local_ec = local_e0->key[lVar11];
        }
        pRVar8 = local_d0;
      } while (lVar11 < local_e0->n);
    }
    uVar3 = ref_dict_free(local_e0);
    if (uVar3 == 0) {
      return 0;
    }
    pcVar7 = "free dict";
    uVar6 = 0x1ca;
  }
  else {
    pcVar7 = "create dict";
    uVar6 = 0x196;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar6,
         "ref_export_tec_surf_zone",(ulong)uVar3,pcVar7);
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tec_surf_zone(REF_GRID ref_grid,
                                                   FILE *file) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *g2l, *l2g;
  REF_INT nface;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT boundary_tag, boundary_index;

  ref_node = ref_grid_node(ref_grid);

  RSS(ref_dict_create(&ref_dict), "create dict");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) RSS(
      ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
      "mark tri");

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) RSS(
      ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
      "mark qua");

  each_ref_dict_key(ref_dict, boundary_index, boundary_tag) {
    RSS(ref_grid_tri_qua_id_nodes(ref_grid, boundary_tag, &nnode, &nface, &g2l,
                                  &l2g),
        "extract this boundary");

    fprintf(file,
            "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            boundary_tag, nnode, nface, "point", "fequadrilateral");

    for (node = 0; node < nnode; node++)
      fprintf(file, " %.16e %.16e %.16e\n",
              ref_node_xyz(ref_node, 0, l2g[node]),
              ref_node_xyz(ref_node, 1, l2g[node]),
              ref_node_xyz(ref_node, 2, l2g[node]));

    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        nodes[3] = nodes[2];
        for (node = 0; node < 4; node++) {
          fprintf(file, " %d", g2l[nodes[node]] + 1);
        }
        fprintf(file, "\n");
      }
    }

    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        for (node = 0; node < 4; node++)
          fprintf(file, " %d", g2l[nodes[node]] + 1);
        fprintf(file, "\n");
      }
    }

    ref_free(l2g);
    ref_free(g2l);
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}